

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bag.cpp
# Opt level: O2

const_iterator __thiscall
minibag::Bag::checkField
          (Bag *this,M_string *fields,string *field,uint min_len,uint max_len,bool required)

{
  const_iterator cVar1;
  ostream *poVar2;
  BagFormatException *pBVar3;
  string sStack_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&fields->_M_t,field);
  if ((_Rb_tree_header *)cVar1._M_node == &(fields->_M_t)._M_impl.super__Rb_tree_header) {
    if (required) {
      pBVar3 = (BagFormatException *)__cxa_allocate_exception(0x10);
      std::operator+(&sStack_1d8,"Required \'",field);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     &sStack_1d8,"\' field missing");
      BagFormatException::BagFormatException(pBVar3,(string *)&ss);
      __cxa_throw(pBVar3,&BagFormatException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else if ((cVar1._M_node[2]._M_parent < (_Base_ptr)(ulong)min_len) ||
          ((_Base_ptr)(ulong)max_len < cVar1._M_node[2]._M_parent)) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar2 = std::operator<<(local_1a8,"Field \'");
    poVar2 = std::operator<<(poVar2,(string *)field);
    poVar2 = std::operator<<(poVar2," is wrong size (");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2," bytes)");
    pBVar3 = (BagFormatException *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    BagFormatException::BagFormatException(pBVar3,&sStack_1d8);
    __cxa_throw(pBVar3,&BagFormatException::typeinfo,std::runtime_error::~runtime_error);
  }
  return (const_iterator)cVar1._M_node;
}

Assistant:

M_string::const_iterator Bag::checkField(M_string const& fields, string const& field, unsigned int min_len, unsigned int max_len, bool required) const {
    M_string::const_iterator fitr = fields.find(field);
    if (fitr == fields.end()) {
        if (required)
            throw BagFormatException("Required '" + field + "' field missing");
    }
    else if ((fitr->second.size() < min_len) || (fitr->second.size() > max_len))
    {
        std::stringstream ss;
        ss << "Field '" << field << " is wrong size (" << (uint32_t) fitr->second.size() << " bytes)";
        throw BagFormatException(ss.str());
    }

    return fitr;
}